

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hh
# Opt level: O3

void __thiscall avro::StreamReader::more(StreamReader *this)

{
  int iVar1;
  undefined8 *puVar2;
  size_t n;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = (undefined1 *)0x0;
  do {
    iVar1 = (*this->in_->_vptr_InputStream[2])(this->in_,&this->next_,local_40);
    if ((char)iVar1 == '\0') {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x18);
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"EOF reached","");
      std::runtime_error::runtime_error((runtime_error *)(puVar2 + 1),(string *)local_40);
      *puVar2 = 0x1cc910;
      puVar2[1] = 0x1cc940;
      __cxa_throw(puVar2,&Exception::typeinfo,Exception::~Exception);
    }
  } while (local_40[0] == (undefined1 *)0x0);
  this->end_ = this->next_ + (long)local_40[0];
  return;
}

Assistant:

void more() {
        if (! fill()) {
            throw Exception("EOF reached");
        }
    }